

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O1

void __thiscall indigox::Bond::Bond(Bond *this,Atom_p *a,Atom_p *b)

{
  _Atomic_word *p_Var1;
  int iVar2;
  __weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  utils::CountableObject<indigox::Bond>::__id_generator_ =
       utils::CountableObject<indigox::Bond>::__id_generator_ + 1;
  (this->super_CountableObject<indigox::Bond>).id_ =
       utils::CountableObject<indigox::Bond>::__id_generator_;
  (this->super_enable_shared_from_this<indigox::Bond>)._M_weak_this.
  super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<indigox::Bond>)._M_weak_this.
  super___weak_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->order_ = UNDEFINED_BOND;
  local_28._M_ptr = (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28._M_refcount._M_pi =
       (a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_refcount._M_pi)->_M_weak_count = (local_28._M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_refcount._M_pi)->_M_weak_count = (local_28._M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  std::__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)&this->atoms_,&local_28);
  if (local_28._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_28._M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_28._M_refcount._M_pi)->_M_weak_count;
      (local_28._M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_28._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  local_28._M_ptr = (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28._M_refcount._M_pi =
       (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._M_refcount._M_pi)->_M_weak_count = (local_28._M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_28._M_refcount._M_pi)->_M_weak_count = (local_28._M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  std::__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->atoms_)._M_elems[1].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>
             ,&local_28);
  if (local_28._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_28._M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_28._M_refcount._M_pi)->_M_weak_count;
      (local_28._M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_28._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  this->idx_ = (this->super_CountableObject<indigox::Bond>).id_;
  return;
}

Assistant:

Bond::Bond(Atom_p a, Atom_p b) : utils::CountableObject<Bond>(), mol_() {
    atoms_[0] = Atom_wp(a);
    atoms_[1] = Atom_wp(b);
    idx_ = GetUniqueID();
  }